

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
          (QMovableArrayOps<QRect> *this,qsizetype i,QRect *args)

{
  QRect **ppQVar1;
  QRect *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  QRect *pQVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar7 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004461c3:
    iVar3 = (args->x1).m_i;
    iVar4 = (args->y1).m_i;
    iVar5 = (args->x2).m_i;
    iVar6 = (args->y2).m_i;
    bVar13 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size != 0;
    QArrayDataPointer<QRect>::detachAndGrow
              ((QArrayDataPointer<QRect> *)this,(uint)(i == 0 && bVar13),1,(QRect **)0x0,
               (QArrayDataPointer<QRect> *)0x0);
    pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
    if (i != 0 || !bVar13) {
      pQVar2 = pQVar8 + i;
      memmove(pQVar2 + 1,pQVar8 + i,
              ((this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size - i) * 0x10
             );
      (pQVar2->x1).m_i = iVar3;
      (pQVar2->y1).m_i = iVar4;
      (pQVar2->x2).m_i = iVar5;
      (pQVar2->y2).m_i = iVar6;
      goto LAB_00446265;
    }
    pQVar8[-1].x1.m_i = iVar3;
    pQVar8[-1].y1.m_i = iVar4;
    pQVar8[-1].x2.m_i = iVar5;
    pQVar8[-1].y2.m_i = iVar6;
  }
  else {
    if (((this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size == i) &&
       (pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr,
       (pDVar7->super_QArrayData).alloc !=
       ((long)((long)pQVar8 -
              ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      RVar9.m_i = (args->y1).m_i;
      RVar10.m_i = (args->x2).m_i;
      RVar11.m_i = (args->y2).m_i;
      pQVar8 = pQVar8 + i;
      pQVar8->x1 = (Representation)(args->x1).m_i;
      pQVar8->y1 = (Representation)RVar9.m_i;
      pQVar8->x2 = (Representation)RVar10.m_i;
      pQVar8->y2 = (Representation)RVar11.m_i;
      goto LAB_00446265;
    }
    if ((i != 0) ||
       (pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr,
       (QRect *)((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pQVar8)) goto LAB_004461c3;
    RVar9.m_i = (args->y1).m_i;
    RVar10.m_i = (args->x2).m_i;
    RVar11.m_i = (args->y2).m_i;
    pQVar8[-1].x1 = (Representation)(args->x1).m_i;
    pQVar8[-1].y1 = (Representation)RVar9.m_i;
    pQVar8[-1].x2 = (Representation)RVar10.m_i;
    pQVar8[-1].y2 = (Representation)RVar11.m_i;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_00446265:
  pqVar12 = &(this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }